

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

void __thiscall
crnlib::sparse_bit_array::clear_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint *puVar1;
  uint32 **ppuVar2;
  void *p;
  byte bVar3;
  uint uVar4;
  uint32 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  if (num != 0) {
    uVar7 = (ulong)index;
    if (num == 1) {
      puVar5 = this->m_ppGroups[index >> 9];
      if (puVar5 == (uint32 *)0x0) {
        puVar5 = (uint32 *)crnlib_malloc(0x40);
        if (puVar5 == (uint32 *)0x0) {
          crnlib_assert("p",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.h"
                        ,199);
        }
        puVar5[0xc] = 0;
        puVar5[0xd] = 0;
        puVar5[0xe] = 0;
        puVar5[0xf] = 0;
        puVar5[8] = 0;
        puVar5[9] = 0;
        puVar5[10] = 0;
        puVar5[0xb] = 0;
        puVar5[4] = 0;
        puVar5[5] = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        puVar5[0] = 0;
        puVar5[1] = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        this->m_ppGroups[index >> 9] = puVar5;
      }
      bVar3 = (byte)index & 0x1f;
      puVar1 = (uint *)((long)puVar5 + (ulong)(index >> 3 & 0x3c));
      *puVar1 = *puVar1 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
    }
    else {
      ppuVar2 = this->m_ppGroups;
      do {
        uVar6 = (uint)uVar7;
        if ((0x200 < num) && ((uVar7 & 0x1ff) == 0)) {
          do {
            p = *(void **)((long)this->m_ppGroups + (uVar7 >> 6));
            if (p != (void *)0x0) {
              crnlib_free(p);
              this->m_ppGroups[uVar7 >> 9] = (uint32 *)0x0;
            }
            num = num - 0x200;
            uVar7 = (ulong)((int)uVar7 + 0x200);
          } while (0x1ff < num);
          if (num == 0) {
            return;
          }
          ppuVar2 = this->m_ppGroups;
          do {
            uVar6 = 0x20;
            if (num < 0x20) {
              uVar6 = num;
            }
            if (ppuVar2[uVar7 >> 9] != (uint32 *)0x0) {
              puVar1 = (uint *)((long)ppuVar2[uVar7 >> 9] + (ulong)((uint)(uVar7 >> 3) & 0x3c));
              *puVar1 = *puVar1 & ~((0xffffffffU >> (-(char)uVar6 & 0x1fU)) << ((byte)uVar7 & 0x1f))
              ;
            }
            uVar7 = (ulong)((int)uVar7 + uVar6);
            num = num - uVar6;
          } while (num != 0);
          return;
        }
        uVar8 = 0x20 - (uVar6 & 0x1f);
        if (num <= uVar8) {
          uVar8 = num;
        }
        if (ppuVar2[uVar7 >> 9] != (uint32 *)0x0) {
          puVar1 = ppuVar2[uVar7 >> 9] + ((uVar6 & 0x1ff) >> 5);
          *puVar1 = *puVar1 & ~((0xffffffffU >> (-(char)uVar8 & 0x1fU)) << (sbyte)(uVar6 & 0x1f));
        }
        uVar4 = uVar8;
        if (num == uVar8) {
          uVar4 = 0;
        }
        uVar7 = (ulong)(uVar6 + uVar4);
        num = num - uVar8;
      } while (num != 0);
    }
  }
  return;
}

Assistant:

void sparse_bit_array::clear_bit_range(uint index, uint num)
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return;
        }
        else if (num == 1)
        {
            clear_bit(index);
            return;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;

            const uint dword_bit_ofs = group_bit_ofs & 31;
            const uint max_bits_to_set = 32 - dword_bit_ofs;

            const uint bits_to_set = math::minimum(max_bits_to_set, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));
                pGroup[group_bit_ofs >> 5] &= (~(msk << dword_bit_ofs));
            }

            num -= bits_to_set;
            if (!num)
            {
                return;
            }

            index += bits_to_set;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                free_group(pGroup);
                m_ppGroups[group_index] = nullptr;
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_set = math::minimum(32u, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

                pGroup[group_bit_ofs >> 5] &= (~(msk << (group_bit_ofs & 31)));
            }

            num -= bits_to_set;
            index += bits_to_set;
        }
    }